

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckIFrame(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  AttVal *av;
  
  if (0xfffffffc < (doc->access).PRIORITYCHK - 4U) {
    av = prvTidyAttrGetById(node,TidyAttr_SRC);
    BVar1 = hasValue(av);
    if (BVar1 != no) {
      BVar1 = IsValidSrcExtension(av->value);
      if (BVar1 == no) {
        prvTidyReportAccessError(doc,node,0x2d3);
        return;
      }
    }
  }
  return;
}

Assistant:

static void CheckIFrame( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        /* Checks for valid 'SRC' value within the IFRAME element */
        AttVal* av = attrGetSRC( node );
        if ( hasValue(av) )
        {
            if ( !IsValidSrcExtension(av->value) )
                TY_(ReportAccessError)( doc, node, FRAME_SRC_INVALID );
        }
    }
}